

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O3

void __thiscall
lf::io::GmshReader::GmshReader
          (GmshReader *this,
          unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *factory,
          string *filename)

{
  _Head_base<0UL,_lf::mesh::MeshFactory_*,_false> local_1d0;
  _Variant_storage<false,_lf::io::GMshFileV2,_lf::io::GMshFileV4> local_1c8;
  
  local_1d0._M_head_impl =
       (factory->_M_t).
       super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>.
       _M_t.
       super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
       super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
  (factory->_M_t).
  super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = (MeshFactory *)0x0;
  ReadGmshFile((variant<lf::io::GMshFileV2,_lf::io::GMshFileV4> *)&local_1c8,filename);
  GmshReader(this,(unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)
                  &local_1d0,(GmshFileVariant *)&local_1c8);
  std::__detail::__variant::_Variant_storage<false,_lf::io::GMshFileV2,_lf::io::GMshFileV4>::
  ~_Variant_storage(&local_1c8);
  if (local_1d0._M_head_impl != (MeshFactory *)0x0) {
    (*(local_1d0._M_head_impl)->_vptr_MeshFactory[7])();
  }
  return;
}

Assistant:

GmshReader::GmshReader(std::unique_ptr<mesh::MeshFactory> factory,
                       const std::string& filename)
    : GmshReader(std::move(factory), ReadGmshFile(filename)) {}